

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_manager.cpp
# Opt level: O2

void __thiscall
cfdcore_manager_GetSupportedFunction_Test::TestBody(cfdcore_manager_GetSupportedFunction_Test *this)

{
  char *message;
  AssertHelper local_28;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_20;
  AssertionResult gtest_ar;
  
  local_20.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       cfd::core::GetSupportedFunction();
  local_28.data_ = (AssertHelperData *)0x3;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&gtest_ar,"GetSupportedFunction()","GetSupportedFunctionExpect()",
             (unsigned_long *)&local_20,(unsigned_long *)&local_28);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_20);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_manager.cpp"
               ,0x35,message);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_20);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_20);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST(cfdcore_manager, GetSupportedFunction) {
  EXPECT_EQ(GetSupportedFunction(), GetSupportedFunctionExpect());
}